

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_helper.cpp
# Opt level: O2

string * __thiscall
duckdb::TestResultHelper::SQLLogicTestConvertValue_abi_cxx11_
          (string *__return_storage_ptr__,TestResultHelper *this,Value *value,LogicalType *sql_type,
          bool original_sqlite_test)

{
  char cVar1;
  pointer pCVar2;
  type pCVar3;
  char *pcVar4;
  allocator local_c1;
  string str;
  undefined2 *local_a0;
  undefined8 local_98;
  undefined2 local_90 [24];
  LogicalType local_60 [32];
  string local_40 [32];
  
  if (value[0x18] == (Value)0x1) {
    pcVar4 = "NULL";
  }
  else {
    if ((byte)((char)*sql_type - 0x15U) < 3 && original_sqlite_test) {
      pCVar2 = unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
               operator->(&this->runner->con);
      pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator*
                         ((shared_ptr<duckdb::ClientContext,_true> *)pCVar2);
      duckdb::LogicalType::LogicalType((LogicalType *)&str,BIGINT);
      duckdb::Value::CastAs((ClientContext *)&local_a0,(LogicalType *)value,SUB81(pCVar3,0));
      duckdb::Value::ToString_abi_cxx11_();
      duckdb::Value::~Value((Value *)&local_a0);
      duckdb::LogicalType::~LogicalType((LogicalType *)&str);
      return __return_storage_ptr__;
    }
    if (*sql_type != (LogicalType)0xa) {
      pCVar2 = unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
               operator->(&this->runner->con);
      pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator*
                         ((shared_ptr<duckdb::ClientContext,_true> *)pCVar2);
      duckdb::LogicalType::LogicalType(local_60,VARCHAR);
      duckdb::Value::CastAs((ClientContext *)&local_a0,(LogicalType *)value,SUB81(pCVar3,0));
      duckdb::Value::ToString_abi_cxx11_();
      duckdb::Value::~Value((Value *)&local_a0);
      duckdb::LogicalType::~LogicalType(local_60);
      if (str._M_string_length == 0) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"(empty)",(allocator *)&local_a0);
      }
      else {
        std::__cxx11::string::string(local_40,(string *)&str);
        local_a0 = local_90;
        local_90[0] = 0;
        local_98 = 1;
        std::__cxx11::string::string((string *)local_60,"\\0",&local_c1);
        duckdb::StringUtil::Replace(__return_storage_ptr__,local_40,&local_a0,local_60);
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string(local_40);
      }
      std::__cxx11::string::~string((string *)&str);
      return __return_storage_ptr__;
    }
    cVar1 = duckdb::BooleanValue::Get(value);
    pcVar4 = "0";
    if (cVar1 != '\0') {
      pcVar4 = "1";
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

string TestResultHelper::SQLLogicTestConvertValue(Value value, LogicalType sql_type, bool original_sqlite_test) {
	if (value.IsNull()) {
		return "NULL";
	} else {
		if (original_sqlite_test) {
			// sqlite test hashes want us to convert floating point numbers to integers
			switch (sql_type.id()) {
			case LogicalTypeId::DECIMAL:
			case LogicalTypeId::FLOAT:
			case LogicalTypeId::DOUBLE:
				return value.CastAs(*runner.con->context, LogicalType::BIGINT).ToString();
			default:
				break;
			}
		}
		switch (sql_type.id()) {
		case LogicalTypeId::BOOLEAN:
			return BooleanValue::Get(value) ? "1" : "0";
		default: {
			string str = value.CastAs(*runner.con->context, LogicalType::VARCHAR).ToString();
			if (str.empty()) {
				return "(empty)";
			} else {
				return StringUtil::Replace(str, string("\0", 1), "\\0");
			}
		}
		}
	}
}